

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O2

string * __thiscall
FastPForLib::Simple16<true>::name_abi_cxx11_(string *__return_storage_ptr__,Simple16<true> *this)

{
  allocator local_9;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"Simple16",&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const { return "Simple16"; }